

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

CZString * __thiscall Json::Value::CZString::operator=(CZString *this,CZString *other)

{
  ArrayIndex AVar1;
  char *pcVar2;
  
  pcVar2 = this->cstr_;
  this->cstr_ = other->cstr_;
  other->cstr_ = pcVar2;
  AVar1 = this->index_;
  this->index_ = other->index_;
  other->index_ = AVar1;
  return this;
}

Assistant:

Value::CZString& Value::CZString::operator=(CZString other) {
  swap(other);
  return *this;
}